

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall ConfigTest_get_format_Test::TestBody(ConfigTest_get_format_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1c8 [8];
  Message local_1c0 [15];
  allocator<char> local_1b1;
  string local_1b0 [32];
  path local_190;
  undefined1 local_168 [40];
  AssertionResult gtest_ar_2;
  Message local_130 [15];
  allocator<char> local_121;
  string local_120 [32];
  path local_100;
  undefined1 local_d8 [40];
  AssertionResult gtest_ar_1;
  Message local_a0 [24];
  string local_88 [32];
  path local_68;
  undefined1 local_40 [40];
  AssertionResult gtest_ar;
  ConfigTest_get_format_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_68,(char (*) [13])"example.json",auto_format);
  std::__cxx11::string::string(local_88);
  jessilib::config::get_format((path *)local_40,(string *)&local_68);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)(local_40 + 0x20),"config::get_format(\"example.json\")","\"json\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [5])0x69116c);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_88);
  std::filesystem::__cxx11::path::~path(&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_40 + 0x20));
  if (!bVar1) {
    testing::Message::Message(local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_40 + 0x20));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_40 + 0x20));
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_100,(char (*) [13])"example.json",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"xml",&local_121);
  jessilib::config::get_format((path *)local_d8,(string *)&local_100);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)(local_d8 + 0x20),"config::get_format(\"example.json\", \"xml\")","\"xml\""
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [4])"xml");
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::filesystem::__cxx11::path::~path(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_d8 + 0x20));
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_d8 + 0x20));
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_d8 + 0x20));
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_190,(char (*) [8])"example",auto_format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"json",&local_1b1);
  jessilib::config::get_format((path *)local_168,(string *)&local_190);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)(local_168 + 0x20),"config::get_format(\"example\", \"json\")","\"json\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
             (char (*) [5])0x69116c);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::filesystem::__cxx11::path::~path(&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_168 + 0x20));
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)(local_168 + 0x20));
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_168 + 0x20));
  return;
}

Assistant:

TEST(ConfigTest, get_format) {
	EXPECT_EQ(config::get_format("example.json"), "json");
	EXPECT_EQ(config::get_format("example.json", "xml"), "xml");
	EXPECT_EQ(config::get_format("example", "json"), "json");
}